

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O3

string * __thiscall Point::ToString_abi_cxx11_(string *__return_storage_ptr__,Point *this)

{
  ostream *poVar1;
  ostringstream local_198 [8];
  ostringstream oss;
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[",1);
  poVar1 = std::ostream::_M_insert<double>((double)this->mX);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," , ",3);
  poVar1 = std::ostream::_M_insert<double>((double)this->mY);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string Point::ToString()
{
    std::ostringstream oss;
    oss << "[" << mX << " , " << mY << "]";
    return oss.str();
}